

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quit.cpp
# Opt level: O1

void anon_unknown.dwarf_e8a7c::push
               (not_null<pstore::broker::command_processor_*> cp,string *message)

{
  long lVar1;
  undefined8 *puVar2;
  atomic<unsigned_int> mid;
  not_null<const_char_*> nVar3;
  tuple<pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
  this;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar4;
  long *in_FS_OFFSET;
  __single_object msg;
  __uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
  local_40;
  not_null<const_char_*> local_38;
  
  local_38.ptr_ = (message->_M_dataplus)._M_p;
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_38);
  nVar3.ptr_ = local_38.ptr_;
  pstore::details::log_destinations::__tls_init();
  lVar1 = *in_FS_OFFSET;
  if (*(long *)(lVar1 + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar4 = *(undefined8 **)(lVar1 + -8);
    puVar2 = (undefined8 *)puVar4[1];
    for (puVar4 = (undefined8 *)*puVar4; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      (**(code **)(*(long *)*puVar4 + 0x58))((long *)*puVar4,6,"push command ",nVar3.ptr_);
    }
  }
  mid.super___atomic_base<unsigned_int>._M_i = push::mid.super___atomic_base<unsigned_int>._M_i;
  if (0xf4 < message->_M_string_length) {
    pstore::assert_failed
              ("message.length () <= pstore::brokerface::message_type::payload_chars",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/quit.cpp"
               ,0x37);
  }
  LOCK();
  push::mid.super___atomic_base<unsigned_int>._M_i =
       (__atomic_base<unsigned_int>)((int)push::mid.super___atomic_base<unsigned_int>._M_i + 1);
  UNLOCK();
  this.
  super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
  .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
        )operator_new(0x100);
  pstore::brokerface::message_type::message_type
            ((message_type *)
             this.
             super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
             .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl,
             (uint32_t)mid.super___atomic_base<unsigned_int>._M_i,0,1,message);
  local_40._M_t.
  super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
  .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl =
       (tuple<pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
        )(tuple<pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
          )this.
           super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
           .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl;
  pstore::broker::command_processor::push_command(cp.ptr_,(message_ptr *)&local_40,(recorder *)0x0);
  if ((_Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
       )local_40._M_t.
        super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
        .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl !=
      (message_type *)0x0) {
    operator_delete((void *)local_40._M_t.
                            super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
                            .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>.
                            _M_head_impl,0x100);
  }
  return;
}

Assistant:

void push (not_null<pstore::broker::command_processor *> const cp,
               std::string const & message) {
        static std::atomic<std::uint32_t> mid{0};

        log (priority::info, "push command ", pstore::logger::quoted{message.c_str ()});

        PSTORE_ASSERT (message.length () <= pstore::brokerface::message_type::payload_chars);
        auto msg = std::make_unique<pstore::brokerface::message_type> (mid++, std::uint16_t{0},
                                                                       std::uint16_t{1}, message);
        cp->push_command (std::move (msg), nullptr);
    }